

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_DCtx_setFormat(ZSTD_DCtx *dctx,ZSTD_format_e format)

{
  size_t sVar1;
  ZSTD_dParameter in_ESI;
  ZSTD_DCtx *in_RDI;
  int in_stack_fffffffffffffff0;
  
  sVar1 = ZSTD_DCtx_setParameter(in_RDI,in_ESI,in_stack_fffffffffffffff0);
  return sVar1;
}

Assistant:

size_t ZSTD_DCtx_setFormat(ZSTD_DCtx* dctx, ZSTD_format_e format)
{
    return ZSTD_DCtx_setParameter(dctx, ZSTD_d_format, (int)format);
}